

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vacuum.cpp
# Opt level: O1

void __thiscall wasm::Vacuum::visitFunction(Vacuum *this,Function *curr)

{
  Nop *output;
  Expression *pEVar1;
  char cVar2;
  Signature SVar3;
  EffectAnalyzer local_198;
  
  pEVar1 = curr->body;
  SVar3 = HeapType::getSignature(&curr->type);
  pEVar1 = optimize(this,pEVar1,SVar3.results.id.id != 0,true);
  if (pEVar1 == (Expression *)0x0) {
    pEVar1 = curr->body;
    pEVar1->_id = NopId;
    (pEVar1->type).id = 0;
  }
  else {
    curr->body = pEVar1;
  }
  SVar3 = HeapType::getSignature(&curr->type);
  if (SVar3.results.id.id == 0) {
    EffectAnalyzer::EffectAnalyzer
              (&local_198,
               &((this->
                 super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                 ).super_Pass.runner)->options,
               (this->
               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
               ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
               super_PostWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
               super_Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.currModule,curr);
    if (local_198.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      cVar2 = '\0';
      if ((local_198.danglingPop != false) ||
         (local_198.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count != 0))
      goto LAB_0093ebb3;
      if ((local_198.writesMemory == false) &&
         ((((local_198.writesTable == false && (local_198.writesStruct == false)) &&
           (local_198.writesArray == false)) &&
          ((local_198.isAtomic == false && (local_198.calls == false)))))) {
        cVar2 = '\0';
        if ((local_198.throws_ == false) &&
           (cVar2 = '\0',
           local_198.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
          cVar2 = '\0';
          if (((local_198.branchesOut == false) &&
              (cVar2 = '\0',
              local_198.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) &&
             (cVar2 = '\x01', local_198.trap == true)) {
            cVar2 = local_198.trapsNeverHappen;
          }
        }
        goto LAB_0093ebb3;
      }
    }
  }
  cVar2 = '\0';
LAB_0093ebb3:
  if (SVar3.results.id.id == 0) {
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_198.delegateTargets._M_t);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_198.breakTargets._M_t);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_198.globalsWritten._M_t);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_198.mutableGlobalsRead._M_t);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_198.localsWritten._M_t);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_198.localsRead._M_t);
    if (local_198.funcEffectsMap.
        super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_198.funcEffectsMap.
                 super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  if (cVar2 != '\0') {
    pEVar1 = curr->body;
    pEVar1->_id = NopId;
    (pEVar1->type).id = 0;
  }
  return;
}

Assistant:

void visitFunction(Function* curr) {
    auto* optimized =
      optimize(curr->body, curr->getResults() != Type::none, true);
    if (optimized) {
      curr->body = optimized;
    } else {
      ExpressionManipulator::nop(curr->body);
    }
    if (curr->getResults() == Type::none &&
        !EffectAnalyzer(getPassOptions(), *getModule(), curr)
           .hasUnremovableSideEffects()) {
      ExpressionManipulator::nop(curr->body);
    }
  }